

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage
          (ParseContext *this,MessageLite *msg,char *ptr)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  undefined4 extraout_var;
  char *pcVar4;
  int old;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  pcVar3 = ReadSizeAndPushLimitAndDepth(this,ptr,&local_14);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    iVar2 = (*msg->_vptr_MessageLite[10])(msg,pcVar3,this);
    pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
  }
  this->depth_ = this->depth_ + 1;
  bVar1 = EpsCopyInputStream::PopLimit(&this->super_EpsCopyInputStream,local_14);
  pcVar4 = (char *)0x0;
  if (bVar1) {
    pcVar4 = pcVar3;
  }
  return pcVar4;
}

Assistant:

const char* ParseContext::ParseMessage(MessageLite* msg, const char* ptr) {
  int old;
  ptr = ReadSizeAndPushLimitAndDepth(ptr, &old);
  ptr = ptr ? msg->_InternalParse(ptr, this) : nullptr;
  depth_++;
  if (!PopLimit(old)) return nullptr;
  return ptr;
}